

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O0

void __thiscall
DynamicKReach::fix_changes
          (DynamicKReach *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  value_type vVar1;
  byte bVar2;
  vertex_t v;
  bool bVar3;
  reference __args_1;
  const_reference pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  reference puVar6;
  byte *pbVar7;
  reference pvVar8;
  uint *nxt;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  uint w_1;
  uchar d;
  uint *prv;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint *w;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  DynamicKReach *this_local;
  
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->updated_);
  w = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->updated_);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&w), bVar3) {
    __args_1 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
    pvVar5 = Graph::predecessors(this->graph_,*__args_1);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar5);
    prv = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar5);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&prv), bVar3) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6);
      bVar2 = *pbVar7;
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__args_1)
      ;
      if (bVar2 + 1 < (uint)*pbVar7) {
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6)
        ;
        vVar1 = *pvVar8;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (dist,(ulong)*__args_1);
        *pvVar8 = vVar1 + '\x01';
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__args_1);
    std::
    priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
    ::emplace<unsigned_char&,unsigned_int_const&>
              ((priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
                *)&this->quedist_,pvVar8,__args_1);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  while (bVar3 = std::
                 priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
                 ::empty(&this->quedist_), ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
             ::top(&this->quedist_);
    bVar2 = pvVar4->first;
    pvVar4 = std::
             priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
             ::top(&this->quedist_);
    v = pvVar4->second;
    std::
    priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
    ::pop(&this->quedist_);
    if (bVar2 < this->k_) {
      pvVar5 = Graph::successors(this->graph_,v);
      __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar5);
      nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar5);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&nxt), bVar3) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2_1);
        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar6)
        ;
        if (bVar2 + 1 < (uint)*pbVar7) {
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar6);
          *pvVar8 = bVar2 + 1;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar6);
          std::
          priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
          ::emplace<unsigned_char&,unsigned_int_const&>
                    ((priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
                      *)&this->quedist_,pvVar8,puVar6);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2_1);
      }
    }
  }
  return;
}

Assistant:

void DynamicKReach::fix_changes(std::vector<distance_t> &dist) {
    for (const auto &w : updated_) {
        for (const auto &prv : graph_.predecessors(w)) {
            if (dist.at(prv) + 1 < dist.at(w)) {
                dist.at(w) = dist.at(prv) + 1;
            }
        }
        quedist_.emplace(dist.at(w), w);
    }
    while (!quedist_.empty()) {
        auto d = quedist_.top().first;
        auto w = quedist_.top().second;
        quedist_.pop();
        if (d >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(w)) {
            if (dist.at(nxt) > d + 1) {
                dist.at(nxt) = d + 1;
                quedist_.emplace(dist.at(nxt), nxt);
            }
        }
    }
}